

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

TabPosition __thiscall QMainWindow::tabPosition(QMainWindow *this,DockWidgetArea area)

{
  bool bVar1;
  DockWidgetArea in_ESI;
  QMainWindowLayout *in_RDI;
  DockWidgetArea in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = checkDockWidgetArea(in_stack_ffffffffffffffe8,(char *)in_RDI);
  if (bVar1) {
    d_func((QMainWindow *)0x5ea313);
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea322);
    local_4 = QMainWindowLayout::tabPosition(in_RDI,in_ESI);
  }
  else {
    local_4 = South;
  }
  return local_4;
}

Assistant:

QTabWidget::TabPosition QMainWindow::tabPosition(Qt::DockWidgetArea area) const
{
    if (!checkDockWidgetArea(area, "QMainWindow::tabPosition"))
        return QTabWidget::South;
    return d_func()->layout->tabPosition(area);
}